

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Operator * __thiscall
parser::Parser::uniary(Operator *__return_storage_ptr__,Parser *this,TokenType t)

{
  string local_98;
  string local_78;
  allocator<char> local_41;
  string local_40;
  TokenType local_1c;
  Parser *pPStack_18;
  TokenType t_local;
  Parser *this_local;
  
  local_1c = t;
  pPStack_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if (t == MINUS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"-",&local_41);
    Operator::Operator(__return_storage_ptr__,UMINUS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else if (t == BANG) {
    std::__cxx11::string::string((string *)&local_78,&(this->curToken).Literal);
    Operator::Operator(__return_storage_ptr__,BANG,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_98,&(this->curToken).Literal);
    Operator::Operator(__return_storage_ptr__,ERROR,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Operator Parser::uniary(TokenType t)
{
    switch (t) {
    case TokenType::MINUS:
       return Operator(TokenType::UMINUS, "-");
    case TokenType::BANG:
        return Operator(TokenType::BANG, curToken.Literal);
    default:
        return Operator(TokenType::ERROR, curToken.Literal);
    }
}